

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

string * __thiscall
KokkosTools::SpaceTimeStack::StackNode::get_full_name_abi_cxx11_
          (string *__return_storage_ptr__,StackNode *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  while (this = this->parent, this != (StackNode *)0x0) {
    if (((this->name)._M_string_length != 0) || (this->parent != (StackNode *)0x0)) {
      std::operator+(&bStack_68,&this->name,'/');
      std::operator+(&local_48,&bStack_68,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&bStack_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_full_name() const {
    std::string full_name = this->name;
    for (auto p = this->parent; p; p = p->parent) {
      if (p->name.empty() && !p->parent) continue;
      full_name = p->name + '/' + full_name;
    }
    return full_name;
  }